

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_test.cc
# Opt level: O0

EVP_MD * GetDigest(FileTest *t,string *name)

{
  bool bVar1;
  Message *pMVar2;
  AssertHelper local_40 [3];
  Message local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  string *name_local;
  FileTest *t_local;
  
  local_20 = name;
  name_local = (string *)t;
  bVar1 = std::operator==(name,"MD5");
  if (bVar1) {
    t_local = (FileTest *)EVP_md5();
  }
  else {
    bVar1 = std::operator==(local_20,"SHA1");
    if (bVar1) {
      t_local = (FileTest *)EVP_sha1();
    }
    else {
      bVar1 = std::operator==(local_20,"SHA224");
      if (bVar1) {
        t_local = (FileTest *)EVP_sha224();
      }
      else {
        bVar1 = std::operator==(local_20,"SHA256");
        if (bVar1) {
          t_local = (FileTest *)EVP_sha256();
        }
        else {
          bVar1 = std::operator==(local_20,"SHA384");
          if (bVar1) {
            t_local = (FileTest *)EVP_sha384();
          }
          else {
            bVar1 = std::operator==(local_20,"SHA512");
            if (bVar1) {
              t_local = (FileTest *)EVP_sha512();
            }
            else {
              testing::Message::Message(&local_28);
              pMVar2 = testing::Message::operator<<(&local_28,(char (*) [17])"Unknown digest: ");
              pMVar2 = testing::Message::operator<<(pMVar2,local_20);
              testing::internal::AssertHelper::AssertHelper
                        (local_40,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/evp_test.cc"
                         ,0x3e,"Failed");
              testing::internal::AssertHelper::operator=(local_40,pMVar2);
              testing::internal::AssertHelper::~AssertHelper(local_40);
              testing::Message::~Message(&local_28);
              t_local = (FileTest *)0x0;
            }
          }
        }
      }
    }
  }
  return (EVP_MD *)t_local;
}

Assistant:

static const EVP_MD *GetDigest(FileTest *t, const std::string &name) {
  if (name == "MD5") {
    return EVP_md5();
  } else if (name == "SHA1") {
    return EVP_sha1();
  } else if (name == "SHA224") {
    return EVP_sha224();
  } else if (name == "SHA256") {
    return EVP_sha256();
  } else if (name == "SHA384") {
    return EVP_sha384();
  } else if (name == "SHA512") {
    return EVP_sha512();
  }
  ADD_FAILURE() << "Unknown digest: " << name;
  return nullptr;
}